

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O0

void __thiscall jsonip::semantic_state::array_start(semantic_state *this)

{
  helper *phVar1;
  reference pvVar2;
  pair<jsonip::holder,_const_jsonip::helper_*> local_20;
  semantic_state *local_10;
  semantic_state *this_local;
  
  local_10 = this;
  pre(this);
  pvVar2 = std::
           vector<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
           ::back(&this->state);
  phVar1 = pvVar2->second;
  pvVar2 = std::
           vector<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
           ::back(&this->state);
  (*phVar1->_vptr_helper[8])(phVar1,pvVar2);
  std::pair<jsonip::holder,_const_jsonip::helper_*>::
  pair<jsonip::holder,_const_jsonip::helper_*,_true>(&local_20);
  std::
  vector<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
  ::push_back(&this->state,&local_20);
  return;
}

Assistant:

void array_start()
        {
            pre();
            state.back().second->array_start(state.back().first);
            state.push_back(state_t()); // adds a placeholder
        }